

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O2

void __thiscall gl4cts::TextureFilterMinmaxUtils::TextureCube::TextureCube(TextureCube *this)

{
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"vec3",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"samplerCube",&local_4a);
  SupportedTextureType::SupportedTextureType
            (&this->super_SupportedTextureType,0x8513,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_SupportedTextureType)._vptr_SupportedTextureType =
       (_func_int **)&PTR_getTextureGL_01dda230;
  (this->m_texture).super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>.m_data
  .ptr = (TextureCube *)0x0;
  return;
}

Assistant:

TextureFilterMinmaxUtils::TextureCube::TextureCube() : SupportedTextureType(GL_TEXTURE_CUBE_MAP, "vec3", "samplerCube")
{
}